

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O3

CURLcode Curl_ssl_shutdown(connectdata *conn,int sockindex)

{
  int iVar1;
  CURLcode CVar2;
  
  iVar1 = (*Curl_ssl->shutdown)(conn,sockindex);
  CVar2 = CURLE_SSL_SHUTDOWN_FAILED;
  if (iVar1 == 0) {
    conn->ssl[sockindex].use = false;
    conn->ssl[sockindex].state = ssl_connection_none;
    conn->recv[sockindex] = Curl_recv_plain;
    conn->send[sockindex] = Curl_send_plain;
    CVar2 = CURLE_OK;
  }
  return CVar2;
}

Assistant:

CURLcode Curl_ssl_shutdown(struct connectdata *conn, int sockindex)
{
  if(Curl_ssl->shutdown(conn, sockindex))
    return CURLE_SSL_SHUTDOWN_FAILED;

  conn->ssl[sockindex].use = FALSE; /* get back to ordinary socket usage */
  conn->ssl[sockindex].state = ssl_connection_none;

  conn->recv[sockindex] = Curl_recv_plain;
  conn->send[sockindex] = Curl_send_plain;

  return CURLE_OK;
}